

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  char cVar1;
  void *pvVar2;
  arg_info *datain;
  undefined1 *puVar3;
  LinkedListPool<depspawn::internal::arg_info,_true,_false> *this_00;
  long in_RDI;
  arg_info *p;
  arg_info *q;
  arg_info *h;
  char *endptr;
  char *baseptr;
  memory_order __b;
  value_type *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *local_50;
  void *local_30;
  
  local_50 = PoolAllocator_malloc_free<false>::malloc
                       ((long)(*(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x1c)));
  pvVar2 = (void *)((long)local_50 +
                   (long)(*(int *)(in_RDI + 0x1c) * (*(int *)(in_RDI + 0x18) + -1)));
  local_30 = local_50;
  do {
    local_30 = (void *)((long)local_30 + (long)*(int *)(in_RDI + 0x1c));
    memset(local_50,0,0x28);
    *(void **)((long)local_50 + 0x18) = local_30;
    local_50 = *(void **)((long)local_50 + 0x18);
  } while (local_30 <= pvVar2);
  do {
    datain = (arg_info *)(in_RDI + 0x28);
    this_00 = (LinkedListPool<depspawn::internal::arg_info,_true,_false> *)0x1;
    LOCK();
    cVar1 = (char)datain->addr;
    *(undefined1 *)&datain->addr = 1;
    UNLOCK();
    in_stack_ffffffffffffff94 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff94);
  } while (cVar1 != '\0');
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::
  push_back((vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            in_stack_ffffffffffffff88);
  freeLinkedList(this_00,datain,
                 (arg_info *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
  puVar3 = (undefined1 *)(in_RDI + 0x28);
  std::operator&(memory_order_release,__memory_order_mask);
  *puVar3 = 0;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }